

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::enum_case_name_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_enum_value *tenum_case,
          bool declaration)

{
  string *psVar1;
  string local_78;
  char *local_58;
  char *local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined1 local_22;
  byte local_21;
  t_enum_value *ptStack_20;
  bool declaration_local;
  t_enum_value *tenum_case_local;
  t_swift_generator *this_local;
  string *name;
  
  local_22 = 0;
  local_21 = declaration;
  ptStack_20 = tenum_case;
  tenum_case_local = (t_enum_value *)this;
  this_local = (t_swift_generator *)__return_storage_ptr__;
  psVar1 = t_enum_value::get_name_abi_cxx11_(tenum_case);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38._M_current = (char *)std::__cxx11::string::end();
  local_40 = (char *)std::__cxx11::string::begin();
  local_58 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (local_30,local_38,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_40,tolower);
  if ((local_21 & 1) != 0) {
    maybe_escape_identifier(&local_78,this,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::enum_case_name(t_enum_value* tenum_case, bool declaration) {
  string name = tenum_case->get_name();
  // force to lowercase for Swift style, maybe escape if its a keyword
  std::transform(name.begin(), name.end(), name.begin(), ::tolower);
  if (declaration) {
    name = maybe_escape_identifier(name);
  }
  return name;
}